

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_tec_ratio(REF_EDGE ref_edge,char *filename)

{
  uint uVar1;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_DBL ratio;
  REF_INT node;
  REF_INT edge;
  REF_NODE ref_node;
  char *filename_local;
  REF_EDGE ref_edge_local;
  
  _node = ref_edge->node;
  ref_node = (REF_NODE)filename;
  filename_local = (char *)ref_edge;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",ref_node);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x292,
           "ref_edge_tec_ratio","unable to open file");
    ref_edge_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine scalar file\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"ratio\"\n");
    fprintf(__stream,"zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)(*(int *)filename_local << 1),(ulong)*(uint *)filename_local,"point",
            "felineseg");
    for (ratio._4_4_ = 0; ratio._4_4_ < *(int *)filename_local; ratio._4_4_ = ratio._4_4_ + 1) {
      uVar1 = ref_node_ratio(_node,*(REF_INT *)
                                    (*(long *)(filename_local + 8) + (long)(ratio._4_4_ << 1) * 4),
                             *(REF_INT *)
                              (*(long *)(filename_local + 8) + (long)(ratio._4_4_ * 2 + 1) * 4),
                             (REF_DBL *)&file);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x29f,"ref_edge_tec_ratio",(ulong)uVar1,"rat");
        return uVar1;
      }
      ratio._0_4_ = *(int *)(*(long *)(filename_local + 8) + (long)(ratio._4_4_ << 1) * 4);
      fprintf(__stream," %.16e %.16e %.16e %.16e\n",_node->real[ratio._0_4_ * 0xf],
              _node->real[ratio._0_4_ * 0xf + 1],_node->real[ratio._0_4_ * 0xf + 2],file);
      ratio._0_4_ = *(int *)(*(long *)(filename_local + 8) + (long)(ratio._4_4_ * 2 + 1) * 4);
      fprintf(__stream," %.16e %.16e %.16e %.16e\n",_node->real[ratio._0_4_ * 0xf],
              _node->real[ratio._0_4_ * 0xf + 1],_node->real[ratio._0_4_ * 0xf + 2],file);
    }
    for (ratio._4_4_ = 0; ratio._4_4_ < *(int *)filename_local; ratio._4_4_ = ratio._4_4_ + 1) {
      fprintf(__stream," %d %d\n",(ulong)(ratio._4_4_ * 2 + 1),(ulong)(ratio._4_4_ * 2 + 2));
    }
    fclose(__stream);
    ref_edge_local._4_4_ = 0;
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_ratio(REF_EDGE ref_edge, const char *filename) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT edge;
  REF_INT node;
  REF_DBL ratio;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"ratio\"\n");

  fprintf(
      file,
      "zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      2 * ref_edge_n(ref_edge), ref_edge_n(ref_edge), "point", "felineseg");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_node_ratio(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                       ref_edge_e2n(ref_edge, 1, edge), &ratio),
        "rat");
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ratio);
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ratio);
  }

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++)
    fprintf(file, " %d %d\n", 1 + 2 * edge, 2 + 2 * edge);

  fclose(file);

  return REF_SUCCESS;
}